

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt)

{
  uint uVar1;
  xmlChar xVar2;
  void *value5;
  bool bVar3;
  uint uVar4;
  byte *pbVar5;
  xmlChar *pxVar6;
  xmlXPathObjectPtr pxVar7;
  xmlChar *pxVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  byte *pbVar13;
  int iVar14;
  byte *pbVar15;
  long lVar16;
  double dVar17;
  undefined8 local_48;
  double local_40;
  double local_38;
  
  pbVar13 = ctxt->cur;
  pbVar5 = pbVar13;
  while( true ) {
    pbVar15 = pbVar5 + 1;
    bVar11 = *pbVar5;
    uVar9 = (ulong)bVar11;
    if (0x28 < uVar9) break;
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
      if ((0x11000000000U >> (uVar9 & 0x3f) & 1) != 0) goto switchD_001e5b3e_caseD_27;
      break;
    }
    ctxt->cur = pbVar15;
    pbVar13 = (byte *)(ulong)((int)pbVar13 + 1);
    pbVar5 = pbVar15;
  }
  if ((byte)(bVar11 - 0x30) < 10) goto switchD_001e5b3e_caseD_27;
  switch(bVar11) {
  case 0x27:
    break;
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
switchD_001e5b3e_caseD_28:
    while (((byte)uVar9 < 0x21 && ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0))) {
      ctxt->cur = pbVar15;
      bVar11 = *pbVar15;
      pbVar13 = (byte *)(ulong)((int)pbVar13 + 1);
      pbVar15 = pbVar15 + 1;
      uVar9 = (ulong)bVar11;
    }
    uVar4 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    if ((uVar4 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
LAB_001e5f9c:
      xmlXPathErr(ctxt,7);
      return;
    }
    if (uVar4 < 0x100) {
      if ((0x16 < uVar4 - 0xc0 && 0x19 < (uVar4 & 0xdf) - 0x41) &&
         (((uVar4 < 0xf8 && 0x1e < uVar4 - 0xd8 && ((char)uVar4 != '_')) && ((uVar4 & 0xff) != 0x3a)
          ))) goto LAB_001e5f9c;
    }
    else {
      iVar12 = xmlCharInRange(uVar4,&xmlIsBaseCharGroup);
      if ((iVar12 == 0) && ((8 < uVar4 - 0x3021 && 0x51a5 < uVar4 - 0x4e00) && uVar4 != 0x3007))
      goto LAB_001e5f9c;
    }
    while ((0x3e < uVar4 || ((0x4000800100000000U >> ((ulong)uVar4 & 0x3f) & 1) == 0))) {
      if (uVar4 < 0x100) {
        if ((0x16 < uVar4 - 0xc0 && 0x19 < (uVar4 & 0xdf) - 0x41) &&
           ((9 < uVar4 - 0x30 && 0x1e < uVar4 - 0xd8) && uVar4 < 0xf8)) {
LAB_001e6437:
          if ((0x32 < uVar4 - 0x2d) ||
             ((0x4000000002003U >> ((ulong)(uVar4 - 0x2d) & 0x3f) & 1) == 0)) {
            if (uVar4 < 0x100) {
              uVar4 = (uint)(uVar4 == 0xb7);
            }
            else {
              iVar12 = xmlCharInRange(uVar4,&xmlIsCombiningGroup);
              if (iVar12 != 0) goto LAB_001e6450;
              uVar4 = xmlCharInRange(uVar4,&xmlIsExtenderGroup);
            }
            if (uVar4 == 0) break;
          }
        }
      }
      else {
        iVar12 = xmlCharInRange(uVar4,&xmlIsBaseCharGroup);
        if (((iVar12 == 0) && ((8 < uVar4 - 0x3021 && 0x51a5 < uVar4 - 0x4e00) && uVar4 != 0x3007))
           && (iVar12 = xmlCharInRange(uVar4,&xmlIsDigitGroup), iVar12 == 0)) goto LAB_001e6437;
      }
LAB_001e6450:
      ctxt->cur = ctxt->cur + (int)local_48;
      uVar4 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    }
    pxVar6 = xmlStrndup(pbVar15 + -1,*(int *)&ctxt->cur - (int)pbVar13);
    ctxt->cur = pbVar15 + -1;
    if (pxVar6 == (xmlChar *)0x0) goto LAB_001e5f9c;
    pxVar8 = xmlStrstr(pxVar6,(xmlChar *)"::");
    if (pxVar8 == (xmlChar *)0x0) {
      iVar12 = xmlStrlen(pxVar6);
      lVar16 = (long)iVar12;
      do {
        xVar2 = ctxt->cur[lVar16];
        if (xVar2 != ' ') {
          bVar3 = false;
          if ((xVar2 == '\0') || (bVar3 = false, xVar2 == '/')) goto LAB_001e65de;
          if ((1 < (byte)(xVar2 - 9)) && (xVar2 != '\r')) goto LAB_001e65c7;
        }
        lVar16 = lVar16 + 1;
      } while( true );
    }
    (*xmlFree)(pxVar6);
    pbVar5 = ctxt->cur;
    goto LAB_001e5b4f;
  case 0x2a:
  case 0x2f:
switchD_001e5b3e_caseD_2a:
    xmlXPathCompExprAdd(ctxt,-1,-1,bVar11 == 0x2f ^ XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
    pbVar13 = ctxt->cur;
    while( true ) {
      uVar9 = (ulong)*pbVar13;
      if (0x2f < uVar9) break;
      if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
        if (uVar9 == 0x2f) goto LAB_001e5c8b;
        break;
      }
      ctxt->cur = pbVar13 + 1;
      pbVar13 = pbVar13 + 1;
    }
    goto LAB_001e5e08;
  case 0x2e:
    if (9 < (byte)(*pbVar15 - 0x30)) goto LAB_001e5b4f;
    break;
  default:
    if (bVar11 == 0x40) goto switchD_001e5b3e_caseD_2a;
    if (bVar11 != 0x22) goto switchD_001e5b3e_caseD_28;
  }
switchD_001e5b3e_caseD_27:
  pbVar5 = pbVar5 + 1;
  pbVar13 = pbVar5;
  while( true ) {
    bVar11 = pbVar13[-1];
    uVar9 = (ulong)bVar11;
    if (0x28 < uVar9) break;
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
      if (uVar9 == 0x24) {
        ctxt->cur = pbVar13;
        pxVar6 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
        if (pxVar6 != (xmlChar *)0x0) {
          ctxt->comp->last = -1;
          iVar12 = xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_VARIABLE,0,0,0,pxVar6,
                                       (void *)CONCAT44(local_48._4_4_,(int)local_48));
          if (iVar12 == -1) {
            (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
            (*xmlFree)(pxVar6);
          }
          pbVar13 = ctxt->cur;
          while( true ) {
            if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
            break;
            ctxt->cur = pbVar13 + 1;
            pbVar13 = pbVar13 + 1;
          }
          if ((ctxt->context != (xmlXPathContextPtr)0x0) &&
             (iVar12 = 0x18, (ctxt->context->flags & 2) != 0)) goto LAB_001e5bcb;
          goto LAB_001e5bd0;
        }
        (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
        iVar12 = 4;
        goto LAB_001e5bcb;
      }
      if (uVar9 == 0x28) goto LAB_001e59e0;
      break;
    }
    ctxt->cur = pbVar13;
    pbVar13 = pbVar13 + 1;
    pbVar5 = pbVar5 + 1;
  }
  bVar10 = bVar11 - 0x30;
  if (bVar10 < 10) {
LAB_001e5a03:
    if (ctxt->error == 0) {
      if (bVar11 != 0x2e && bVar11 < 0x30) goto LAB_001e5a23;
      if (bVar10 < 10) {
        dVar17 = 0.0;
        do {
          ctxt->cur = pbVar13;
          dVar17 = (double)((uint)uVar9 & 0xffffff0f) + dVar17 * 10.0;
          bVar11 = *pbVar13;
          uVar9 = (ulong)bVar11;
          pbVar13 = pbVar13 + 1;
        } while ((byte)(bVar11 - 0x30) < 10);
      }
      else {
        dVar17 = 0.0;
      }
      pbVar5 = pbVar13 + -1;
      if (bVar11 == 0x2e) {
        ctxt->cur = pbVar13;
        bVar11 = *pbVar13;
        if (bVar11 < 0x30) {
          if (bVar10 < 10) {
LAB_001e617e:
            uVar4 = 0;
LAB_001e6180:
            local_38 = 0.0;
            if ((byte)(bVar11 - 0x30) < 10) {
              uVar1 = uVar4 + 0x14;
              do {
                pbVar13 = pbVar13 + 1;
                local_38 = local_38 * 10.0 + (double)(int)(bVar11 - 0x30);
                uVar4 = uVar4 + 1;
                ctxt->cur = pbVar13;
                bVar11 = *pbVar13;
                if (9 < (byte)(bVar11 - 0x30)) break;
              } while (uVar4 < uVar1);
            }
            local_40 = dVar17;
            dVar17 = pow(10.0,(double)(int)uVar4);
            dVar17 = local_40 + local_38 / dVar17;
            pbVar5 = ctxt->cur;
            bVar11 = *pbVar5;
            while ((byte)(bVar11 - 0x30) < 10) {
              pbVar5 = pbVar5 + 1;
              ctxt->cur = pbVar5;
              bVar11 = *pbVar5;
            }
            goto LAB_001e621d;
          }
        }
        else if ((bVar10 < 10) || (bVar11 < 0x3a)) {
          if (bVar11 != 0x30) goto LAB_001e617e;
          uVar4 = 0;
          do {
            pbVar13 = pbVar13 + 1;
            uVar4 = uVar4 + 1;
            ctxt->cur = pbVar13;
            bVar11 = *pbVar13;
          } while (bVar11 == 0x30);
          goto LAB_001e6180;
        }
LAB_001e5a23:
        iVar12 = 1;
        goto LAB_001e5bcb;
      }
LAB_001e621d:
      if ((bVar11 | 0x20) == 0x65) {
        pbVar13 = pbVar5 + 1;
        ctxt->cur = pbVar13;
        bVar11 = pbVar5[1];
        if ((bVar11 == 0x2d) || (bVar10 = bVar11, bVar11 == 0x2b)) {
          pbVar13 = pbVar5 + 2;
          ctxt->cur = pbVar13;
          bVar10 = pbVar5[2];
        }
        iVar12 = 0;
        if ((byte)(bVar10 - 0x30) < 10) {
          iVar12 = 0;
          do {
            pbVar13 = pbVar13 + 1;
            iVar14 = (bVar10 - 0x30) + iVar12 * 10;
            if (999999 < iVar12) {
              iVar14 = iVar12;
            }
            iVar12 = iVar14;
            ctxt->cur = pbVar13;
            bVar10 = *pbVar13;
          } while ((byte)(bVar10 - 0x30) < 10);
        }
        iVar14 = -iVar12;
        if (bVar11 != 0x2d) {
          iVar14 = iVar12;
        }
        local_40 = dVar17;
        dVar17 = pow(10.0,(double)iVar14);
        dVar17 = local_40 * dVar17;
      }
      pxVar7 = xmlXPathCacheNewFloat(ctxt->context,dVar17);
      if (pxVar7 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar12 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,3,0,0,pxVar7,
                                     (void *)0x0);
        if (iVar12 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar7);
        }
      }
    }
  }
  else {
    pbVar15 = pbVar13;
    if (bVar11 == 0x22) {
      while( true ) {
        ctxt->cur = pbVar15;
        do {
          uVar4 = (uint)*pbVar15;
          if (*pbVar15 < 0x20) {
            if ((0xd < uVar4) || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_001e65ba;
            goto LAB_001e5e98;
          }
        } while (uVar4 == 0);
        if (uVar4 == 0x22) break;
LAB_001e5e98:
        pbVar15 = pbVar15 + 1;
      }
    }
    else {
      if (bVar11 != 0x27) {
        if ((bVar11 != 0x2e) || (9 < (byte)(*pbVar13 - 0x30))) {
          pxVar6 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
          if (pxVar6 == (xmlChar *)0x0) {
            (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
          }
          else {
            pbVar13 = ctxt->cur;
            while( true ) {
              pbVar5 = pbVar13 + 1;
              uVar9 = (ulong)*pbVar13;
              if (0x28 < uVar9) break;
              if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
                if (uVar9 == 0x28) goto LAB_001e5fc1;
                break;
              }
              ctxt->cur = pbVar5;
              pbVar13 = pbVar5;
            }
            (*xmlFree)(pxVar6);
            (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
          }
LAB_001e6084:
          iVar12 = 7;
          goto LAB_001e5bcb;
        }
        goto LAB_001e5a03;
      }
      while( true ) {
        ctxt->cur = pbVar15;
        do {
          uVar4 = (uint)*pbVar15;
          if (*pbVar15 < 0x20) {
            if ((0xd < uVar4) || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_001e65ba;
            goto LAB_001e5e63;
          }
        } while (uVar4 == 0);
        if (uVar4 == 0x27) break;
LAB_001e5e63:
        pbVar15 = pbVar15 + 1;
      }
    }
    pxVar6 = xmlStrndup(pbVar13,(int)pbVar15 - (int)pbVar5);
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    if (pxVar6 != (xmlChar *)0x0) {
      pxVar7 = xmlXPathCacheNewString(ctxt->context,pxVar6);
      if (pxVar7 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar12 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,4,0,0,pxVar7,
                                     (void *)0x0);
        if (iVar12 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar7);
        }
      }
      (*xmlFree)(pxVar6);
    }
  }
  goto LAB_001e5bd0;
LAB_001e65c7:
  if (((xVar2 == '(') && (iVar12 = xmlXPathIsNodeType(pxVar6), iVar12 == 0)) &&
     ((ctxt->xptr == 0 || (iVar12 = xmlStrEqual(pxVar6,(xmlChar *)"range-to"), iVar12 == 0)))) {
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
LAB_001e65de:
  xVar2 = ctxt->cur[lVar16];
  (*xmlFree)(pxVar6);
  pbVar5 = ctxt->cur;
  if ((!bVar3) || (xVar2 == '\0')) {
LAB_001e5b4f:
    bVar11 = *pbVar5;
    goto switchD_001e5b3e_caseD_2a;
  }
  goto switchD_001e5b3e_caseD_27;
LAB_001e5c8b:
  do {
    pbVar13 = ctxt->cur;
    if (*pbVar13 != 0x2f) break;
    if (pbVar13[1] == 0x2f) {
      pbVar13 = pbVar13 + 2;
      while( true ) {
        ctxt->cur = pbVar13;
        if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
        break;
        pbVar13 = pbVar13 + 1;
      }
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
LAB_001e5d22:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
    else {
      do {
        pbVar13 = pbVar13 + 1;
        ctxt->cur = pbVar13;
        bVar11 = *pbVar13;
        uVar9 = (ulong)bVar11;
        if (0x20 < uVar9) goto LAB_001e5cd2;
      } while ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0);
      if (uVar9 != 0) {
LAB_001e5cd2:
        if (((byte)((bVar11 & 0xdf) + 0xbf) < 0x1a) ||
           ((bVar11 - 0x2a < 0x36 &&
            ((0x20000000400011U >> ((ulong)(bVar11 - 0x2a) & 0x3f) & 1) != 0)))) goto LAB_001e5d22;
      }
    }
  } while (ctxt->error == 0);
  goto LAB_001e5e10;
LAB_001e59e0:
  while( true ) {
    ctxt->cur = pbVar13;
    if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) break;
    pbVar13 = pbVar13 + 1;
  }
  xmlXPathCompileExpr(ctxt,1);
  if (ctxt->error == 0) {
    pbVar13 = ctxt->cur;
    if (*pbVar13 == 0x29) {
      do {
        pbVar13 = pbVar13 + 1;
        ctxt->cur = pbVar13;
        if (0x20 < (ulong)*pbVar13) break;
      } while ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0);
      goto LAB_001e5bd0;
    }
    xmlXPathErr(ctxt,7);
  }
  goto LAB_001e5d46;
LAB_001e65ba:
  iVar12 = 2;
LAB_001e5bcb:
  xmlXPathErr(ctxt,iVar12);
  goto LAB_001e5bd0;
LAB_001e5fc1:
  while( true ) {
    ctxt->cur = pbVar5;
    if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
    pbVar5 = pbVar5 + 1;
  }
  value5 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
  uVar4 = 1;
  if ((value5 == (void *)0x0) && (*pxVar6 == 'c')) {
    iVar12 = xmlStrEqual(pxVar6,(xmlChar *)"count");
    uVar4 = (uint)(iVar12 == 0);
    pbVar5 = ctxt->cur;
  }
  ctxt->comp->last = -1;
  iVar12 = -1;
  iVar14 = 0;
  if ((*pbVar5 == 0) || (iVar14 = 0, *pbVar5 == 0x29)) {
LAB_001e6617:
    iVar12 = xmlXPathCompExprAdd(ctxt,iVar12,-1,XPATH_OP_FUNCTION,iVar14,0,0,pxVar6,value5);
    if (iVar12 == -1) {
      (*xmlFree)(value5);
      (*xmlFree)(pxVar6);
    }
    pbVar13 = ctxt->cur;
    if (*pbVar13 != 0) goto LAB_001e66a3;
    while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))) {
LAB_001e66a3:
      pbVar13 = pbVar13 + 1;
      ctxt->cur = pbVar13;
    }
  }
  else {
    xmlXPathCompileExpr(ctxt,uVar4);
    if (ctxt->error == 0) {
      iVar14 = 0;
      iVar12 = -1;
      do {
        xmlXPathCompExprAdd(ctxt,iVar12,ctxt->comp->last,XPATH_OP_ARG,0,0,0,(void *)0x0,(void *)0x0)
        ;
        iVar14 = iVar14 + 1;
        pbVar13 = ctxt->cur;
        if (*pbVar13 != 0x2c) {
          if (*pbVar13 != 0x29) {
            (*xmlFree)(pxVar6);
            (*xmlFree)(value5);
            goto LAB_001e6084;
          }
LAB_001e6610:
          iVar12 = ctxt->comp->last;
          goto LAB_001e6617;
        }
        do {
          pbVar13 = pbVar13 + 1;
          ctxt->cur = pbVar13;
          uVar9 = (ulong)*pbVar13;
          if (0x20 < uVar9) goto LAB_001e6552;
        } while ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0);
        if (uVar9 == 0) goto LAB_001e6610;
LAB_001e6552:
        local_40 = (double)CONCAT44(local_40._4_4_,ctxt->comp->last);
        ctxt->comp->last = -1;
        xmlXPathCompileExpr(ctxt,uVar4);
        iVar12 = local_40._0_4_;
      } while (ctxt->error == 0);
    }
    (*xmlFree)(pxVar6);
    (*xmlFree)(value5);
  }
LAB_001e5bd0:
  pbVar13 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar13 + 1;
    pbVar13 = pbVar13 + 1;
  }
LAB_001e5d46:
  if (ctxt->error == 0) {
    pbVar13 = ctxt->cur;
    while( true ) {
      bVar11 = *pbVar13;
      if ((0x20 < (ulong)bVar11) || ((0x100002600U >> ((ulong)bVar11 & 0x3f) & 1) == 0)) break;
      pbVar13 = pbVar13 + 1;
      ctxt->cur = pbVar13;
    }
    if (bVar11 == 0x5b) {
      do {
        xmlXPathCompPredicate(ctxt,1);
        pbVar13 = ctxt->cur;
        while( true ) {
          bVar11 = *pbVar13;
          if ((0x20 < (ulong)bVar11) || ((0x100002600U >> ((ulong)bVar11 & 0x3f) & 1) == 0)) break;
          pbVar13 = pbVar13 + 1;
          ctxt->cur = pbVar13;
        }
      } while (bVar11 == 0x5b);
      if (ctxt->error != 0) {
        return;
      }
    }
    if (bVar11 == 0x2f) {
      if (pbVar13[1] == 0x2f) {
        pbVar13 = pbVar13 + 2;
        while( true ) {
          ctxt->cur = pbVar13;
          if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
          break;
          pbVar13 = pbVar13 + 1;
        }
        xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0)
        ;
      }
LAB_001e5e08:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
LAB_001e5e10:
    pbVar13 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar13 + 1;
      pbVar13 = pbVar13 + 1;
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt) {
    int lc = 1;           /* Should we branch to LocationPath ?         */
    xmlChar *name = NULL; /* we may have to preparse a name to find out */

    SKIP_BLANKS;
    if ((CUR == '$') || (CUR == '(') ||
	(IS_ASCII_DIGIT(CUR)) ||
        (CUR == '\'') || (CUR == '"') ||
	(CUR == '.' && IS_ASCII_DIGIT(NXT(1)))) {
	lc = 0;
    } else if (CUR == '*') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '/') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '@') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else if (CUR == '.') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else {
	/*
	 * Problem is finding if we have a name here whether it's:
	 *   - a nodetype
	 *   - a function call in which case it's followed by '('
	 *   - an axis in which case it's followed by ':'
	 *   - a element name
	 * We do an a priori analysis here rather than having to
	 * maintain parsed token content through the recursive function
	 * calls. This looks uglier but makes the code easier to
	 * read/write/debug.
	 */
	SKIP_BLANKS;
	name = xmlXPathScanName(ctxt);
	if ((name != NULL) && (xmlStrstr(name, (xmlChar *) "::") != NULL)) {
#ifdef DEBUG_STEP
	    xmlGenericError(xmlGenericErrorContext,
		    "PathExpr: Axis\n");
#endif
	    lc = 1;
	    xmlFree(name);
	} else if (name != NULL) {
	    int len =xmlStrlen(name);


	    while (NXT(len) != 0) {
		if (NXT(len) == '/') {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if (IS_BLANK_CH(NXT(len))) {
		    /* ignore blanks */
		    ;
		} else if (NXT(len) == ':') {
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '(')) {
		    /* Node Type or Function */
		    if (xmlXPathIsNodeType(name)) {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: Type search\n");
#endif
			lc = 1;
#ifdef LIBXML_XPTR_ENABLED
                    } else if (ctxt->xptr &&
                               xmlStrEqual(name, BAD_CAST "range-to")) {
                        lc = 1;
#endif
		    } else {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: function call\n");
#endif
			lc = 0;
		    }
                    break;
		} else if ((NXT(len) == '[')) {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '<') || (NXT(len) == '>') ||
			   (NXT(len) == '=')) {
		    lc = 1;
		    break;
		} else {
		    lc = 1;
		    break;
		}
		len++;
	    }
	    if (NXT(len) == 0) {
#ifdef DEBUG_STEP
		xmlGenericError(xmlGenericErrorContext,
			"PathExpr: AbbrRelLocation\n");
#endif
		/* element name */
		lc = 1;
	    }
	    xmlFree(name);
	} else {
	    /* make sure all cases are covered explicitly */
	    XP_ERROR(XPATH_EXPR_ERROR);
	}
    }

    if (lc) {
	if (CUR == '/') {
	    PUSH_LEAVE_EXPR(XPATH_OP_ROOT, 0, 0);
	} else {
	    PUSH_LEAVE_EXPR(XPATH_OP_NODE, 0, 0);
	}
	xmlXPathCompLocationPath(ctxt);
    } else {
	xmlXPathCompFilterExpr(ctxt);
	CHECK_ERROR;
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;

	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);

	    xmlXPathCompRelativeLocationPath(ctxt);
	} else if (CUR == '/') {
	    xmlXPathCompRelativeLocationPath(ctxt);
	}
    }
    SKIP_BLANKS;
}